

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

bool createdir(char *path)

{
  int iVar1;
  size_t __n;
  
  __n = strlen(path);
  if (path[__n - 1] == '/') {
    strncpy(createdir::strip,path,__n);
    (&DAT_001976af)[__n] = 0;
    path = createdir::strip;
  }
  iVar1 = mkdir(path,0x1ff);
  return iVar1 == 0;
}

Assistant:

bool createdir(const char *path)
{
    size_t len = strlen(path);
    if(path[len-1]==PATHDIV)
    {
        static string strip;
        path = copystring(strip, path, len);
    }
#ifdef WIN32
    return CreateDirectory(path, NULL)!=0;
#else
    return mkdir(path, 0777)==0;
#endif
}